

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void __thiscall
HighsHashTable<int,_void>::makeEmptyTable(HighsHashTable<int,_void> *this,u64 capacity)

{
  uchar *puVar1;
  _Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false> _Var2;
  ulong uVar3;
  uchar *__s;
  _Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false> _Var4;
  
  this->tableSizeMask = capacity - 1;
  uVar3 = 0x3f;
  if (capacity != 0) {
    for (; capacity >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  this->numHashShift = ~uVar3 + 0x41;
  this->numElements = 0;
  __s = (uchar *)operator_new__(capacity);
  memset(__s,0,capacity);
  puVar1 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  _Var4._M_head_impl = (HighsHashTableEntry<int,_void> *)operator_new(capacity << 2);
  _Var2._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl;
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var2._M_head_impl != (HighsHashTableEntry<int,_void> *)0x0) {
    operator_delete(_Var2._M_head_impl);
    return;
  }
  return;
}

Assistant:

void makeEmptyTable(u64 capacity) {
    tableSizeMask = capacity - 1;
    numHashShift = 64 - HighsHashHelpers::log2i(capacity);
    assert(capacity == (u64{1} << (64 - numHashShift)));
    numElements = 0;

    metadata = decltype(metadata)(new u8[capacity]{});
    entries =
        decltype(entries)((Entry*)::operator new(sizeof(Entry) * capacity));
  }